

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

ufile_error curl_do(CURL *curl)

{
  CURL *pCVar1;
  int iVar2;
  bool bVar3;
  ufile_error uVar4;
  ulong local_30;
  long response_code;
  CURL *pCStack_20;
  CURLcode curl_code;
  CURL *curl_local;
  ufile_error error;
  
  curl_local = (CURL *)0x0;
  error._0_8_ = (long)"RetCode=%d;\nmessage=%s\n" + 0x17;
  pCStack_20 = curl;
  response_code._4_4_ = curl_easy_perform(curl);
  if (response_code._4_4_ == 0) {
    iVar2 = curl_easy_getinfo(pCStack_20,0x200002,&local_30);
    if (iVar2 == 0) {
      if ((long)local_30 / 100 != 2) {
        error._0_8_ = anon_var_dwarf_326f;
      }
      curl_local = (CURL *)(local_30 & 0xffffffff);
      pCVar1 = curl_local;
      curl_local._0_4_ = (int)local_30;
      bVar3 = (int)curl_local == 0x194;
      curl_local = pCVar1;
      if (bVar3) {
        error._0_8_ = anon_var_dwarf_3285;
      }
    }
    else {
      curl_local = (CURL *)0xffffffec;
      error._0_8_ = anon_var_dwarf_3259;
    }
  }
  else {
    curl_local = (CURL *)CONCAT44(curl_local._4_4_,0xffffffec);
    error._0_8_ = curl_easy_strerror(response_code._4_4_);
  }
  uVar4._0_8_ = (ulong)curl_local & 0xffffffff;
  uVar4.message = (char *)error._0_8_;
  return uVar4;
}

Assistant:

struct ufile_error
curl_do(CURL *curl){
    struct ufile_error error = NO_ERROR;
    CURLcode curl_code = curl_easy_perform(curl);
    if (curl_code != CURLE_OK) {
        error.code = CURL_ERROR_CODE;
        error.message = curl_easy_strerror(curl_code);
        return error;
    }

    long response_code;
    if (curl_easy_getinfo(curl, CURLINFO_RESPONSE_CODE, &response_code) != CURLE_OK){
        error.code = CURL_ERROR_CODE;
        error.message = "Get curl response code failed.";
        return error;
    }

    if (!HTTP_IS_OK(response_code)){
        error.message = "http is not OK, check the code as HTTP code.";
    }

    error.code = response_code;
    if(error.code == 404){
        error.message = "File not found.";
    }
    return error;
}